

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

CPAccessResult cpacr_access(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,_Bool isread)

{
  _Bool _Var1;
  int iVar2;
  
  if ((env->features & 0x8000000) != 0) {
    iVar2 = arm_current_el(env);
    if (((iVar2 == 1) && ((*(byte *)((long)(env->cp15).cptr_el + 0x13) & 0x80) != 0)) &&
       (_Var1 = arm_is_secure(env), !_Var1)) {
      return CP_ACCESS_TRAP_EL2;
    }
    iVar2 = arm_current_el(env);
    if ((iVar2 < 3) && ((*(byte *)((long)(env->cp15).cptr_el + 0x1b) & 0x80) != 0)) {
      return CP_ACCESS_TRAP_EL3;
    }
  }
  return CP_ACCESS_OK;
}

Assistant:

static CPAccessResult cpacr_access(CPUARMState *env, const ARMCPRegInfo *ri,
                                   bool isread)
{
    if (arm_feature(env, ARM_FEATURE_V8)) {
        /* Check if CPACR accesses are to be trapped to EL2 */
        if (arm_current_el(env) == 1 &&
            (env->cp15.cptr_el[2] & CPTR_TCPAC) && !arm_is_secure(env)) {
            return CP_ACCESS_TRAP_EL2;
        /* Check if CPACR accesses are to be trapped to EL3 */
        } else if (arm_current_el(env) < 3 &&
                   (env->cp15.cptr_el[3] & CPTR_TCPAC)) {
            return CP_ACCESS_TRAP_EL3;
        }
    }

    return CP_ACCESS_OK;
}